

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file_format.cc
# Opt level: O2

string * detect_format(string *__return_storage_ptr__,ifstream *infile,string *filename)

{
  bool bVar1;
  uint __val;
  uint __val_00;
  int iVar2;
  istream *piVar3;
  GraphFileError *pGVar4;
  reference pvVar5;
  ulong uVar6;
  ulong uVar7;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  smatch match;
  string local_2f8;
  string word;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298;
  string local_278;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream line_stream;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)infile,(string *)&line);
  if ((((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) ||
     (line._M_string_length == 0)) {
    pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&line_stream,"unable to read file to detect file format",
               (allocator<char> *)&match);
    GraphFileError::GraphFileError(pGVar4,filename,(string *)&line_stream,true);
    __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::dimacs_comment_abi_cxx11_ == '\0')
  {
    iVar2 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 dimacs_comment_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                  dimacs_comment_abi_cxx11_,"c(\\s.*)?",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                    dimacs_comment_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           dimacs_comment_abi_cxx11_);
    }
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::dimacs_problem_abi_cxx11_ == '\0')
  {
    iVar2 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 dimacs_problem_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                  dimacs_problem_abi_cxx11_,"p\\s+(edge|col)\\s+(\\d+)\\s+(\\d+)?\\s*",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                    dimacs_problem_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           dimacs_problem_abi_cxx11_);
    }
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_header_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 lad_header_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_header_abi_cxx11_,
                 "\\d+",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_header_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           lad_header_abi_cxx11_);
    }
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_zero_labelled_line_abi_cxx11_
      == '\0') {
    iVar2 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 lad_zero_labelled_line_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                  lad_zero_labelled_line_abi_cxx11_,"0 \\d+",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                    lad_zero_labelled_line_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           lad_zero_labelled_line_abi_cxx11_);
    }
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_zero_unlabelled_line_abi_cxx11_
      == '\0') {
    iVar2 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 lad_zero_unlabelled_line_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                  lad_zero_unlabelled_line_abi_cxx11_,"0",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                    lad_zero_unlabelled_line_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           lad_zero_unlabelled_line_abi_cxx11_);
    }
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_line_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 lad_line_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_line_abi_cxx11_,
                 "\\d+\\s+(\\d+\\s+)*\\d+\\s*",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_line_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           lad_line_abi_cxx11_);
    }
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::csv_problem_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 csv_problem_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::csv_problem_abi_cxx11_,
                 "\\S+[,>]\\S+",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                    csv_problem_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           csv_problem_abi_cxx11_);
    }
  }
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match._M_begin._M_current = (char *)0x0;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (&line,&match,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                      dimacs_comment_abi_cxx11_,0);
  if (bVar1) {
    while( true ) {
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (&line,&match,
                         &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                          dimacs_comment_abi_cxx11_,0);
      if (!bVar1) break;
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)infile,(string *)&line);
      if ((((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) ||
         (line._M_string_length == 0)) {
        pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&line_stream,"unable to auto-detect file format (entirely c lines?)",
                   (allocator<char> *)&word);
        GraphFileError::GraphFileError(pGVar4,filename,(string *)&line_stream,true);
        __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
    }
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (&line,&match,
                       &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                        dimacs_problem_abi_cxx11_,0);
    if (!bVar1) {
      pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&line_stream,
                 "unable to auto-detect file format (c line not followed by a p line?)",
                 (allocator<char> *)&word);
      GraphFileError::GraphFileError(pGVar4,filename,(string *)&line_stream,true);
      __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"dimacs",(allocator<char> *)&line_stream);
  }
  else {
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (&line,&match,
                       &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                        dimacs_problem_abi_cxx11_,0);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"dimacs",(allocator<char> *)&line_stream);
    }
    else {
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (&line,&match,
                         &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                          lad_header_abi_cxx11_,0);
      if (bVar1) {
        bVar1 = std::operator==(&line,"0");
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"lad",(allocator<char> *)&line_stream);
        }
        else {
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)infile,(string *)&line);
          if ((((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) ||
             (line._M_string_length == 0)) {
            pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&line_stream,
                       "unable to auto-detect file format (number followed by nothing)",
                       (allocator<char> *)&word);
            GraphFileError::GraphFileError(pGVar4,filename,(string *)&line_stream,true);
            __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
          }
          bVar1 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                            (&line,&match,
                             &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                              lad_zero_labelled_line_abi_cxx11_,0);
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"labelledlad",
                       (allocator<char> *)&line_stream);
          }
          else {
            bVar1 = std::
                    regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                              (&line,&match,
                               &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                lad_zero_unlabelled_line_abi_cxx11_,0);
            if (bVar1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"lad",(allocator<char> *)&line_stream);
            }
            else {
              bVar1 = std::
                      regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                                (&line,&match,
                                 &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                  lad_line_abi_cxx11_,0);
              if (!bVar1) {
                pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&line_stream,
                           "unable to auto-detect file format (looks like lad, but no edge line found)"
                           ,(allocator<char> *)&word);
                GraphFileError::GraphFileError(pGVar4,filename,(string *)&line_stream,true);
                __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
              }
              std::__cxx11::stringstream::stringstream
                        ((stringstream *)&line_stream,(string *)&line,_S_out|_S_in);
              word._M_dataplus._M_p = (pointer)&word.field_2;
              word._M_string_length = 0;
              words.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              words.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              words.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              word.field_2._M_local_buf[0] = '\0';
              while( true ) {
                piVar3 = std::operator>>((istream *)&line_stream,(string *)&word);
                if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &words,&word);
              }
              if ((ulong)((long)words.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)words.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
                pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2f8,
                           "unable to auto-detect file format (not enough words in a lad line)",
                           (allocator<char> *)&local_2b8);
                GraphFileError::GraphFileError(pGVar4,filename,&local_2f8,true);
                __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
              }
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::at(&words,0);
              __val = std::__cxx11::stoi(pvVar5,(size_t *)0x0,10);
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::at(&words,1);
              __val_00 = std::__cxx11::stoi(pvVar5,(size_t *)0x0,10);
              uVar7 = (ulong)(__val_00 * 2 + 2);
              uVar6 = (long)words.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)words.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5;
              if (uVar6 == __val + 1) {
                if (uVar6 == uVar7) {
                  pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2f8,"unable to auto-detect between lad or labelledlad"
                             ,(allocator<char> *)&local_2b8);
                  GraphFileError::GraphFileError(pGVar4,filename,&local_2f8,true);
                  __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,"lad",(allocator<char> *)&local_2f8);
              }
              else {
                if (uVar6 != uVar7) {
                  pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
                  std::__cxx11::to_string
                            (&local_258,
                             (long)words.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)words.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
                  std::operator+(&local_238,
                                 "unable to auto-detect file format (looks like lad, but got ",
                                 &local_258);
                  std::operator+(&local_218,&local_238," items on a line with first two elements ");
                  std::__cxx11::to_string(&local_278,__val);
                  std::operator+(&local_1f8,&local_218,&local_278);
                  std::operator+(&local_1d8,&local_1f8," and ");
                  std::__cxx11::to_string(&local_298,__val_00);
                  std::operator+(&local_2b8,&local_1d8,&local_298);
                  std::operator+(&local_2f8,&local_2b8,")");
                  GraphFileError::GraphFileError(pGVar4,filename,&local_2f8,true);
                  __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,"labelledlad",
                           (allocator<char> *)&local_2f8);
              }
              std::__cxx11::string::~string((string *)&word);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&words);
              std::__cxx11::stringstream::~stringstream((stringstream *)&line_stream);
            }
          }
        }
      }
      else {
        bVar1 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          (&line,&match,
                           &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                            csv_problem_abi_cxx11_,0);
        if (!bVar1) {
          pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&line_stream,
                     "unable to auto-detect file format (no recognisable header found)",
                     (allocator<char> *)&word);
          GraphFileError::GraphFileError(pGVar4,filename,(string *)&line_stream,true);
          __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"csv",(allocator<char> *)&line_stream);
      }
    }
  }
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&match);
  std::__cxx11::string::~string((string *)&line);
  return __return_storage_ptr__;
}

Assistant:

auto detect_format(ifstream & infile, const string & filename) -> string
{
    string line;
    if (! getline(infile, line) || line.empty())
        throw GraphFileError{filename, "unable to read file to detect file format", true};

    static const regex
        dimacs_comment{R"(c(\s.*)?)"},
        dimacs_problem{R"(p\s+(edge|col)\s+(\d+)\s+(\d+)?\s*)"},
        lad_header{R"(\d+)"},
        lad_zero_labelled_line{R"(0 \d+)"},
        lad_zero_unlabelled_line{R"(0)"},
        lad_line{R"(\d+\s+(\d+\s+)*\d+\s*)"},
        csv_problem{R"(\S+[,>]\S+)"};

    smatch match;
    if (regex_match(line, match, dimacs_comment)) {
        while (regex_match(line, match, dimacs_comment)) {
            // looks like a DIMACS comment, ignore
            if (! getline(infile, line) || line.empty())
                throw GraphFileError{filename, "unable to auto-detect file format (entirely c lines?)", true};
        }
        if (! regex_match(line, match, dimacs_problem))
            throw GraphFileError{filename, "unable to auto-detect file format (c line not followed by a p line?)", true};
        return "dimacs";
    }
    else if (regex_match(line, match, dimacs_problem))
        return "dimacs";
    else if (regex_match(line, match, lad_header)) {
        if ("0" == line)
            return "lad";

        // got to figure out whether we're labelled or not
        if (! getline(infile, line) || line.empty())
            throw GraphFileError{filename, "unable to auto-detect file format (number followed by nothing)", true};
        if (regex_match(line, match, lad_zero_labelled_line))
            return "labelledlad";
        else if (regex_match(line, match, lad_zero_unlabelled_line))
            return "lad";
        else if (regex_match(line, match, lad_line)) {
            stringstream line_stream{line};
            vector<string> words;
            string word;
            while (line_stream >> word)
                words.emplace_back(word);

            if (words.size() < 2)
                throw GraphFileError{filename, "unable to auto-detect file format (not enough words in a lad line)", true};

            unsigned items_if_lad = stoi(words.at(0)), items_if_labelledlad = stoi(words.at(1));
            if (words.size() == items_if_lad + 1 && ! (words.size() == (2 * items_if_labelledlad) + 2))
                return "lad";
            else if (! (words.size() == items_if_lad + 1) && (words.size() == (2 * items_if_labelledlad) + 2))
                return "labelledlad";
            else if ((words.size() == items_if_lad + 1) && (words.size() == (2 * items_if_labelledlad) + 2))
                throw GraphFileError{filename, "unable to auto-detect between lad or labelledlad", true};
            else
                throw GraphFileError{filename, "unable to auto-detect file format (looks like lad, but got " + to_string(words.size()) + " items on a line with first two elements " + to_string(items_if_lad) + " and " + to_string(items_if_labelledlad) + ")", true};
        }
        else
            throw GraphFileError{filename, "unable to auto-detect file format (looks like lad, but no edge line found)", true};
    }
    else if (regex_match(line, match, csv_problem))
        return "csv";

    throw GraphFileError{filename, "unable to auto-detect file format (no recognisable header found)", true};
}